

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_registry.c
# Opt level: O3

void curious_init_file_registry(void)

{
  curious_init_mount_tree();
  create_curious_dynamic_array(&file_registry,3,0x18);
  curious_register_file_by_fd(0);
  curious_register_file_by_fd(1);
  curious_register_file_by_fd(2);
  return;
}

Assistant:

void curious_init_file_registry()
{
    curious_init_mount_tree();
    create_curious_dynamic_array(&file_registry, 3, sizeof(curious_file_record_t));

    //lookup the actual filenames of the standard I/O files
    curious_register_file_by_fd(STDIN_FILENO);
    curious_register_file_by_fd(STDOUT_FILENO);
    curious_register_file_by_fd(STDERR_FILENO);
}